

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_function.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateExpression
          (StatisticsPropagator *this,BoundFunctionExpression *func,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  bool bVar1;
  size_type sVar2;
  pointer ptr_p;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *in_RCX;
  BoundFunctionExpression *in_RDX;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *in_RSI;
  ClientContext *in_RDI;
  FunctionStatisticsInput input;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stat;
  idx_t i;
  vector<duckdb::BaseStatistics,_true> stats;
  value_type *in_stack_fffffffffffffe58;
  BaseStatistics *in_stack_fffffffffffffe60;
  BoundFunctionExpression *expr_p;
  size_type in_stack_fffffffffffffe88;
  ulong uVar3;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> type;
  BaseStatistics *this_00;
  optional_ptr<duckdb::FunctionData,_true> local_150;
  FunctionStatisticsInput local_148;
  undefined4 local_124;
  ulong local_50;
  undefined1 local_38 [32];
  BoundFunctionExpression *local_18;
  
  this_00 = (BaseStatistics *)local_38;
  type._M_head_impl = (BaseStatistics *)in_RDI;
  local_38._24_8_ = in_RCX;
  local_18 = in_RDX;
  vector<duckdb::BaseStatistics,_true>::vector((vector<duckdb::BaseStatistics,_true> *)0x19cddb3);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          *)&local_18->children);
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::reserve
            ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)in_RDI,
             in_stack_fffffffffffffe88);
  local_50 = 0;
  while( true ) {
    uVar3 = local_50;
    sVar2 = ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)&local_18->children);
    if (sVar2 <= uVar3) break;
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
    PropagateExpression((StatisticsPropagator *)this_00,in_RSI);
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                        *)0x19cde5d);
    if (bVar1) {
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe60);
      BaseStatistics::Copy(this_00);
      ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::push_back
                ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)
                 in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      BaseStatistics::~BaseStatistics(in_stack_fffffffffffffe60);
    }
    else {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe60);
      LogicalType::LogicalType(&in_stack_fffffffffffffe60->type,&in_stack_fffffffffffffe58->type);
      BaseStatistics::CreateUnknown(&(type._M_head_impl)->type);
      ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::push_back
                ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)
                 in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      BaseStatistics::~BaseStatistics(in_stack_fffffffffffffe60);
      LogicalType::~LogicalType((LogicalType *)0x19cdef9);
    }
    unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
    ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 *)0x19cdff7);
    local_50 = local_50 + 1;
  }
  if ((local_18->function).statistics == (function_statistics_t)0x0) {
    unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
    unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  }
  else {
    expr_p = local_18;
    ptr_p = ::std::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>::get
                      ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                        *)local_18);
    optional_ptr<duckdb::FunctionData,_true>::optional_ptr(&local_150,ptr_p);
    FunctionStatisticsInput::FunctionStatisticsInput
              (&local_148,expr_p,local_150,(vector<duckdb::BaseStatistics,_true> *)local_38,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_38._24_8_);
    (*(local_18->function).statistics)
              (in_RDI,(FunctionStatisticsInput *)
                      in_RSI[1].
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl);
  }
  local_124 = 1;
  vector<duckdb::BaseStatistics,_true>::~vector((vector<duckdb::BaseStatistics,_true> *)0x19ce0db);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         type._M_head_impl;
}

Assistant:

unique_ptr<BaseStatistics> StatisticsPropagator::PropagateExpression(BoundFunctionExpression &func,
                                                                     unique_ptr<Expression> &expr_ptr) {
	vector<BaseStatistics> stats;
	stats.reserve(func.children.size());
	for (idx_t i = 0; i < func.children.size(); i++) {
		auto stat = PropagateExpression(func.children[i]);
		if (!stat) {
			stats.push_back(BaseStatistics::CreateUnknown(func.children[i]->return_type));
		} else {
			stats.push_back(stat->Copy());
		}
	}
	if (!func.function.statistics) {
		return nullptr;
	}
	FunctionStatisticsInput input(func, func.bind_info.get(), stats, &expr_ptr);
	return func.function.statistics(context, input);
}